

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O3

int AddWordToVocab(char *word)

{
  long lVar1;
  longlong lVar2;
  vocab_word *__ptr;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  size_t sVar9;
  
  sVar5 = strlen(word);
  uVar3 = (int)sVar5 + 1;
  sVar5 = 100;
  if (uVar3 < 100) {
    sVar5 = (size_t)uVar3;
  }
  pcVar6 = (char *)calloc(sVar5,1);
  lVar2 = vocab_size;
  vocab[vocab_size].word = pcVar6;
  strcpy(vocab[lVar2].word,word);
  __ptr = vocab;
  vocab[vocab_size].cn = 0;
  lVar1 = vocab_size + 1;
  lVar7 = vocab_size + 3;
  vocab_size = lVar1;
  if (vocab_max_size <= lVar7) {
    lVar1 = vocab_max_size * 8;
    vocab_max_size = vocab_max_size + 1000;
    vocab = (vocab_word *)realloc(__ptr,(lVar1 + 8000) * 5);
  }
  sVar5 = strlen(word);
  uVar8 = 0;
  uVar3 = 0;
  if (sVar5 != 0) {
    sVar9 = 0;
    do {
      uVar8 = (long)word[sVar9] + uVar8 * 0x101;
      sVar9 = sVar9 + 1;
    } while (sVar5 != sVar9);
    uVar3 = (int)uVar8 + (int)(uVar8 / 30000000) * -30000000;
  }
  uVar8 = (ulong)uVar3;
  if (vocab_hash[uVar8] != -1) {
    uVar8 = (ulong)uVar3;
    do {
      uVar3 = (int)uVar8 + 1;
      if (uVar3 == 30000000) {
        uVar3 = 0;
      }
      uVar8 = (ulong)uVar3;
    } while (vocab_hash[uVar8] != -1);
  }
  iVar4 = (int)vocab_size + -1;
  vocab_hash[uVar8] = iVar4;
  return iVar4;
}

Assistant:

int AddWordToVocab(char *word) {
  unsigned int hash, length = strlen(word) + 1;
  if (length > MAX_STRING) length = MAX_STRING;
  vocab[vocab_size].word = (char *)calloc(length, sizeof(char));
  strcpy(vocab[vocab_size].word, word);
  vocab[vocab_size].cn = 0;
  vocab_size++;
  // Reallocate memory if needed
  if (vocab_size + 2 >= vocab_max_size) {
    vocab_max_size += 1000;
    vocab = (struct vocab_word *)realloc(vocab, vocab_max_size * sizeof(struct vocab_word));
  }
  hash = GetWordHash(word);
  while (vocab_hash[hash] != -1) hash = (hash + 1) % vocab_hash_size;
  vocab_hash[hash] = vocab_size - 1;
  return vocab_size - 1;
}